

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  archive_rb_tree *rbt;
  size_t min;
  char *p;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  zip *pzVar6;
  uLong uVar7;
  bool bVar8;
  int iVar9;
  wchar_t wVar10;
  uint uVar11;
  zip_entry *pzVar12;
  archive_rb_node *paVar13;
  int *piVar14;
  void *pvVar15;
  char *_p;
  la_int64_t lVar16;
  archive_rb_node *paVar17;
  Bytef *p_00;
  long lVar18;
  int *piVar19;
  Bytef *__src;
  archive_rb_node *paVar20;
  ushort uVar21;
  long lVar22;
  uchar *puVar23;
  char *pcVar24;
  int64_t iVar25;
  bool bVar26;
  archive_rb_tree *paVar27;
  Bytef *__dest;
  ulong name_length;
  archive_string *as;
  archive_rb_node *local_90;
  archive_string local_68;
  z_stream *local_50;
  archive_rb_tree *local_48;
  archive_read *local_40;
  long local_38;
  
  pzVar6 = (zip *)a->format->data;
  if (pzVar6->has_encrypted_entries == -1) {
    pzVar6->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar6->zip_entries == (zip_entry *)0x0) {
    bVar8 = false;
    iVar25 = __archive_read_seek(a,pzVar6->central_directory_offset_adjusted,0);
    if (iVar25 < 0) {
      return L'\xffffffe2';
    }
LAB_0014e135:
    if (!bVar8) {
      piVar19 = (int *)__archive_read_ahead(a,0x14,&local_38);
      if (piVar19 == (int *)0x0) {
        return L'\xffffffe2';
      }
      bVar8 = false;
      bVar26 = true;
      lVar18 = 0;
LAB_0014e167:
      lVar22 = lVar18;
      piVar14 = piVar19;
      if ((!bVar26) || (local_38 + -4 <= lVar22)) goto LAB_0014e215;
      cVar1 = *(char *)((long)piVar14 + lVar22 + 3);
      lVar18 = lVar22;
      switch(cVar1) {
      case '\x01':
      case '\x05':
        goto switchD_0014e197_caseD_1;
      case '\x02':
        bVar26 = false;
        bVar8 = true;
        piVar19 = (int *)((long)piVar14 + lVar22);
        if (*(int *)((long)piVar14 + lVar22) != 0x2014b50) goto switchD_0014e197_caseD_3;
        goto LAB_0014e167;
      case '\x03':
      case '\x04':
        goto switchD_0014e197_caseD_3;
      case '\x06':
        piVar19 = (int *)((long)piVar14 + lVar22);
        bVar26 = false;
        bVar8 = true;
        if (*(int *)((long)piVar14 + lVar22) == 0x6054b50) goto LAB_0014e167;
        bVar26 = false;
        bVar8 = true;
        if (*piVar19 == 0x6064b50) goto LAB_0014e167;
switchD_0014e197_caseD_1:
        lVar18 = lVar22 + 1;
        goto LAB_0014e204;
      default:
        goto switchD_0014e197_default;
      }
    }
    lVar16 = archive_filter_bytes(&a->archive,0);
    lVar18 = pzVar6->central_directory_offset;
    rbt = &pzVar6->tree;
    __archive_rb_tree_init(rbt,&rb_ops);
    local_48 = &pzVar6->tree_rsrc;
    __archive_rb_tree_init(local_48,&rb_rsrc_ops);
    pzVar6->central_directory_entries_total = 0;
    local_40 = a;
    while( true ) {
      piVar19 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
      if (piVar19 == (int *)0x0) {
        return L'\xffffffe2';
      }
      if ((*piVar19 == 0x6064b50) || (*piVar19 == 0x6054b50)) {
        pzVar12 = (zip_entry *)__archive_rb_tree_iterate(rbt,(archive_rb_node *)0x0,0);
        pzVar6->entry = pzVar12;
        goto LAB_0014e0e0;
      }
      if (*piVar19 != 0x2014b50) {
        pcVar24 = "Invalid central directory signature";
        iVar9 = -1;
        goto LAB_0014e781;
      }
      pvVar15 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
      if (pvVar15 == (void *)0x0) {
        return L'\xffffffe2';
      }
      pzVar12 = (zip_entry *)calloc(1,0x90);
      if (pzVar12 == (zip_entry *)0x0) break;
      pzVar12->next = pzVar6->zip_entries;
      pzVar12->flags = '\x02';
      pzVar6->zip_entries = pzVar12;
      pzVar6->central_directory_entries_total = pzVar6->central_directory_entries_total + 1;
      pzVar12->system = *(uchar *)((long)pvVar15 + 5);
      uVar3 = *(ushort *)((long)pvVar15 + 8);
      pzVar12->zip_flags = uVar3;
      if ((uVar3 & 0x41) != 0) {
        pzVar6->has_encrypted_entries = 1;
      }
      pzVar12->compression = *(uchar *)((long)pvVar15 + 10);
      iVar25 = dos_to_unix(*(uint32_t *)((long)pvVar15 + 0xc));
      pzVar12->mtime = iVar25;
      pzVar12->crc32 = *(uint32_t *)((long)pvVar15 + 0x10);
      puVar23 = (uchar *)((long)pvVar15 + 0x13);
      if ((pzVar12->zip_flags & 8) != 0) {
        puVar23 = (uchar *)((long)pvVar15 + 0xd);
      }
      pzVar12->decdat = *puVar23;
      pzVar12->compressed_size = (ulong)*(uint *)((long)pvVar15 + 0x14);
      pzVar12->uncompressed_size = (ulong)*(uint *)((long)pvVar15 + 0x18);
      uVar3 = *(ushort *)((long)pvVar15 + 0x1c);
      name_length = (ulong)uVar3;
      uVar4 = *(ushort *)((long)pvVar15 + 0x1e);
      uVar5 = *(ushort *)((long)pvVar15 + 0x20);
      uVar11 = *(uint *)((long)pvVar15 + 0x26);
      pzVar12->local_header_offset = (ulong)*(uint *)((long)pvVar15 + 0x2a) + (lVar16 - lVar18);
      if (pzVar12->system == '\0') {
        uVar21 = 0x41fd;
        if ((uVar11 & 0x10) == 0) {
          uVar21 = 0x81b4;
        }
        pzVar12->mode = uVar21;
        if ((uVar11 & 1) != 0) {
          pzVar12->mode = uVar21 & 0x16d;
        }
      }
      else if (pzVar12->system == '\x03') {
        pzVar12->mode = (uint16_t)(uVar11 >> 0x10);
      }
      else {
        pzVar12->mode = 0;
      }
      __archive_read_consume(a,0x2e);
      min = uVar4 + name_length;
      pcVar24 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
      if (pcVar24 == (char *)0x0) {
        pcVar24 = "Truncated ZIP file header";
        goto LAB_0014e77f;
      }
      p = pcVar24 + name_length;
      local_50 = (z_stream *)(ulong)uVar5;
      wVar10 = process_extra(a,entry,p,(ulong)uVar4,pzVar12);
      if (wVar10 != L'\0') {
        return L'\xffffffe2';
      }
      paVar27 = rbt;
      if (pzVar6->process_mac_extensions == 0) {
LAB_0014e48b:
        __archive_rb_tree_insert_node(paVar27,(archive_rb_node *)pzVar12);
      }
      else {
        _p = rsrc_basename(pcVar24,name_length);
        if (uVar3 < 9) {
          if (name_length != 0) goto LAB_0014e4a2;
          name_length = 0;
        }
        else {
          iVar9 = strncmp("__MACOSX/",pcVar24,9);
          if (iVar9 == 0) {
            if ((p[-1] == '/') ||
               (((2 < (long)_p - (long)pcVar24 && (*_p == '.')) && (_p[1] == '_')))) {
              (pzVar12->rsrcname).length = 0;
              archive_strncat(&pzVar12->rsrcname,pcVar24,name_length);
              paVar27 = local_48;
              goto LAB_0014e48b;
            }
            __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar12);
            local_68.s = (char *)0x0;
            local_68.length = 0;
            local_68.buffer_length = 0;
            archive_strncat(&local_68,pcVar24,name_length);
            paVar27 = local_48;
            while (pcVar24 = strrchr(local_68.s,0x2f), pcVar24 != (char *)0x0) {
              *pcVar24 = '\0';
              paVar13 = __archive_rb_tree_find_node(paVar27,local_68.s);
              if (paVar13 == (archive_rb_node *)0x0) break;
              __archive_rb_tree_remove_node(paVar27,paVar13);
              archive_string_free((archive_string *)(paVar13 + 3));
              __archive_rb_tree_insert_node(rbt,paVar13);
            }
            archive_string_free(&local_68);
            goto LAB_0014e53b;
          }
LAB_0014e4a2:
          if (p[-1] == '/') {
            name_length = name_length - 1;
            _p = rsrc_basename(pcVar24,name_length);
          }
        }
        as = &pzVar12->rsrcname;
        (pzVar12->rsrcname).length = 0;
        archive_strncat(as,"__MACOSX/",9);
        archive_strncat(as,pcVar24,(long)_p - (long)pcVar24);
        archive_strcat(as,"._");
        archive_strncat(as,_p,name_length - ((long)_p - (long)pcVar24));
        __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar12);
        a = local_40;
      }
LAB_0014e53b:
      __archive_read_consume(a,min + (long)local_50);
    }
    pcVar24 = "Can\'t allocate zip entry";
    goto LAB_0014e76b;
  }
  if (pzVar6->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pzVar12 = (zip_entry *)__archive_rb_tree_iterate(&pzVar6->tree,&pzVar6->entry->node,1);
  pzVar6->entry = pzVar12;
LAB_0014e0e0:
  if (pzVar12 == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar24 = (pzVar12->rsrcname).s;
  if (pcVar24 == (char *)0x0) {
    paVar13 = (archive_rb_node *)0x0;
  }
  else {
    paVar13 = __archive_rb_tree_find_node(&pzVar6->tree_rsrc,pcVar24);
  }
  if (pzVar6->cctx_valid != '\0') {
    aes_ctr_release(&pzVar6->cctx);
  }
  if (pzVar6->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar6->hctx);
  }
  pzVar6->hctx_valid = '\0';
  pzVar6->cctx_valid = '\0';
  pzVar6->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar16 = archive_filter_bytes(&a->archive,0);
  lVar18 = pzVar6->entry->local_header_offset;
  lVar22 = lVar18 - lVar16;
  if (lVar22 == 0 || lVar18 < lVar16) {
    if (lVar22 != 0) {
      __archive_read_seek(a,lVar18,0);
    }
  }
  else {
    __archive_read_consume(a,lVar22);
  }
  pzVar6->unconsumed = 0;
  wVar10 = zip_read_local_file_header(a,entry,pzVar6);
  if (wVar10 != L'\0') {
    return wVar10;
  }
  if (paVar13 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar6 = (zip *)a->format->data;
  lVar16 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar13[5].rb_nodes + 1);
  if (bVar2 == 0) {
    paVar20 = paVar13[2].rb_nodes[0];
    if (paVar20 != (archive_rb_node *)paVar13[1].rb_info) {
      pcVar24 = "Malformed OS X metadata entry: inconsistent size";
LAB_0014e77f:
      iVar9 = 0x54;
      goto LAB_0014e781;
    }
  }
  else {
    if (bVar2 != 8) {
      paVar17 = (archive_rb_node *)compression_name((uint)bVar2);
      pcVar24 = "Unsupported ZIP compression method (%s)";
      goto LAB_0014e74e;
    }
    paVar20 = paVar13[2].rb_nodes[0];
  }
  if (0x400000 < (long)paVar20) {
    pcVar24 = "Mac metadata is too large: %jd > 4M bytes";
    paVar17 = paVar20;
LAB_0014e74e:
    archive_set_error(&a->archive,0x54,pcVar24,paVar17);
    return L'\xffffffec';
  }
  paVar17 = (archive_rb_node *)paVar13[1].rb_info;
  if (0x400000 < (long)paVar17) {
    pcVar24 = "Mac metadata is too large: %jd > 4M bytes";
    goto LAB_0014e74e;
  }
  p_00 = (Bytef *)malloc((size_t)paVar20);
  if (p_00 == (Bytef *)0x0) {
    pcVar24 = "Can\'t allocate memory for Mac metadata";
LAB_0014e76b:
    iVar9 = 0xc;
LAB_0014e781:
    archive_set_error(&a->archive,iVar9,pcVar24);
    return L'\xffffffe2';
  }
  paVar20 = paVar13[1].rb_nodes[1];
  lVar18 = (long)paVar20 - lVar16;
  if (lVar18 == 0 || (long)paVar20 < lVar16) {
    if (lVar18 != 0) {
      __archive_read_seek(a,(int64_t)paVar20,0);
    }
  }
  else {
    __archive_read_consume(a,lVar18);
  }
  piVar19 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar19 == (int *)0x0) {
    pcVar24 = "Truncated ZIP file header";
    iVar9 = 0x54;
  }
  else {
    if (*piVar19 == 0x4034b50) {
      iVar25 = (ulong)*(ushort *)((long)piVar19 + 0x1a) + (ulong)*(ushort *)(piVar19 + 7) + 0x1e;
      goto LAB_0014e83b;
    }
    pcVar24 = "Damaged Zip archive";
    iVar9 = -1;
  }
  archive_set_error(&a->archive,iVar9,pcVar24);
  iVar25 = -0x14;
LAB_0014e83b:
  __archive_read_consume(a,iVar25);
  paVar20 = (archive_rb_node *)paVar13[1].rb_info;
  local_90 = paVar13[2].rb_nodes[0];
  local_50 = &pzVar6->stream;
  uVar11 = 0;
  __dest = p_00;
  do {
    if ((uVar11 != 0) || (paVar20 == (archive_rb_node *)0x0)) {
      archive_entry_copy_mac_metadata(entry,p_00,(long)paVar13[2].rb_nodes[0] - (long)local_90);
      wVar10 = L'\0';
LAB_0014e9f8:
      __archive_read_seek(a,lVar16,0);
      pzVar6->decompress_init = '\0';
      free(p_00);
      return wVar10 >> 0x1f & wVar10;
    }
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_68);
    if (__src == (Bytef *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
      wVar10 = L'\xffffffec';
      goto LAB_0014e9f8;
    }
    if (paVar20 < local_68.s) {
      local_68.s = (char *)paVar20;
    }
    if (*(char *)(paVar13[5].rb_nodes + 1) == '\b') {
      wVar10 = zip_deflate_init(a,pzVar6);
      if (wVar10 != L'\0') goto LAB_0014e9f8;
      (pzVar6->stream).next_in = __src;
      (pzVar6->stream).avail_in = (uInt)local_68.s;
      (pzVar6->stream).total_in = 0;
      (pzVar6->stream).next_out = __dest;
      (pzVar6->stream).avail_out = (uInt)local_90;
      (pzVar6->stream).total_out = 0;
      uVar11 = inflate(local_50,0);
      if (1 < uVar11) {
        if (uVar11 == 0xfffffffc) {
          archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
        }
        else {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar11);
        }
        wVar10 = L'\xffffffe2';
        goto LAB_0014e9f8;
      }
      paVar17 = (archive_rb_node *)(pzVar6->stream).total_in;
      uVar7 = (pzVar6->stream).total_out;
      local_90 = (archive_rb_node *)((long)local_90 - uVar7);
      __dest = __dest + uVar7;
    }
    else if (*(char *)(paVar13[5].rb_nodes + 1) == '\0') {
      if (local_90 < local_68.s) {
        local_68.s = (char *)local_90;
      }
      memcpy(__dest,__src,(size_t)local_68.s);
      __dest = __dest + (long)local_68.s;
      local_90 = (archive_rb_node *)((long)local_90 - (long)local_68.s);
      uVar11 = (uint)(local_90 == (archive_rb_node *)0x0);
      paVar17 = (archive_rb_node *)local_68.s;
    }
    else {
      uVar11 = 0;
      paVar17 = (archive_rb_node *)0x0;
    }
    __archive_read_consume(a,(int64_t)paVar17);
    paVar20 = (archive_rb_node *)((long)paVar20 - (long)paVar17);
  } while( true );
LAB_0014e215:
  __archive_read_consume(a,lVar22);
  goto LAB_0014e135;
switchD_0014e197_default:
  bVar26 = true;
  bVar8 = false;
  piVar19 = piVar14;
  lVar18 = lVar22 + 3;
  if (cVar1 != 'P') {
    if (cVar1 == 'K') {
      lVar18 = lVar22 + 2;
    }
    else {
switchD_0014e197_caseD_3:
      lVar18 = lVar22 + 4;
    }
LAB_0014e204:
    bVar26 = true;
    bVar8 = false;
    piVar19 = piVar14;
  }
  goto LAB_0014e167;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, entry, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid
	 * redundant data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}